

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O2

wchar_t breath_dam(wchar_t type,wchar_t hp)

{
  wchar_t wVar1;
  
  wVar1 = hp / projections[type].divisor;
  if (projections[type].damage_cap <= wVar1) {
    wVar1 = projections[type].damage_cap;
  }
  return wVar1;
}

Assistant:

int breath_dam(int type, int hp)
{
	struct projection *element = &projections[type];
	int dam;

	/* Damage is based on monster's current hp */
	dam = hp / element->divisor;

	/* Check for maximum damage */
	if (dam > element->damage_cap)
		dam = element->damage_cap;

	return dam;
}